

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O2

void Gia_SortTest(void)

{
  int *piVar1;
  abctime aVar2;
  abctime aVar3;
  int iVar4;
  int *piVar5;
  
  Abc_Clock();
  printf("Sorting %d integers\n",100000000);
  piVar1 = Gia_SortGetTest(100000000);
  aVar2 = Abc_Clock();
  piVar5 = piVar1;
  qsort(piVar1,100000000,4,num_cmp1);
  iVar4 = (int)piVar5;
  Abc_Print(iVar4,"%s =","qsort  ");
  aVar3 = Abc_Clock();
  Abc_Print(iVar4,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  Gia_SortVerifySorted(piVar1,100000000);
  free(piVar1);
  piVar1 = Gia_SortGetTest(100000000);
  aVar2 = Abc_Clock();
  piVar5 = piVar1;
  sort_rec(piVar1,100000000,num_cmp2);
  iVar4 = (int)piVar5;
  Abc_Print(iVar4,"%s =","minisat");
  aVar3 = Abc_Clock();
  Abc_Print(iVar4,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  Gia_SortVerifySorted(piVar1,100000000);
  free(piVar1);
  piVar1 = Gia_SortGetTest(100000000);
  aVar2 = Abc_Clock();
  piVar5 = piVar1;
  sort_rec2(piVar1,100000000);
  iVar4 = (int)piVar5;
  Abc_Print(iVar4,"%s =","minisat with inlined comparison");
  aVar3 = Abc_Clock();
  Abc_Print(iVar4,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
  Gia_SortVerifySorted(piVar1,100000000);
  free(piVar1);
  return;
}

Assistant:

void Gia_SortTest()
{
    int nSize = 100000000;
    int * pArray;
    abctime clk = Abc_Clock();

    printf( "Sorting %d integers\n", nSize );
    pArray = Gia_SortGetTest( nSize );
clk = Abc_Clock();
    qsort( pArray, nSize, 4, (int (*)(const void *, const void *)) num_cmp1 );
ABC_PRT( "qsort  ", Abc_Clock() - clk );
    Gia_SortVerifySorted( pArray, nSize );
    ABC_FREE( pArray );

    pArray = Gia_SortGetTest( nSize );
clk = Abc_Clock();
    minisat_sort( pArray, nSize, (int (*)(const void *, const void *)) num_cmp2 );
ABC_PRT( "minisat", Abc_Clock() - clk );
    Gia_SortVerifySorted( pArray, nSize );
    ABC_FREE( pArray );

    pArray = Gia_SortGetTest( nSize );
clk = Abc_Clock();
    minisat_sort2( pArray, nSize );
ABC_PRT( "minisat with inlined comparison", Abc_Clock() - clk );
    Gia_SortVerifySorted( pArray, nSize );
    ABC_FREE( pArray );
}